

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_ea2049::TransformSelector::~TransformSelector(TransformSelector *this)

{
  this->_vptr_TransformSelector = (_func_int **)&PTR__TransformSelector_008567c8;
  std::__cxx11::string::~string((string *)&this->Tag);
  return;
}

Assistant:

virtual ~TransformSelector() = default;